

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,BlockStatementSyntax *syntax)

{
  NamedBlockClauseSyntax *pNVar1;
  NamedLabelSyntax *pNVar2;
  StatementBlockKind SVar3;
  SourceLocation SVar4;
  StatementBlockSymbol *pSVar5;
  SourceLocation loc;
  string_view sVar6;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar7;
  string_view name;
  Token token;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffc0;
  Token local_38;
  
  pNVar1 = syntax->blockName;
  if (pNVar1 == (NamedBlockClauseSyntax *)0x0) {
    SVar4 = parsing::Token::location(&syntax->begin);
    pNVar2 = (syntax->super_StatementSyntax).label;
    if (pNVar2 == (NamedLabelSyntax *)0x0) {
      sVar6 = (string_view)(ZEXT816(0x4f3aa0) << 0x40);
      goto LAB_00229d9a;
    }
    local_38.kind = (pNVar2->name).kind;
    local_38._2_1_ = (pNVar2->name).field_0x2;
    local_38.numFlags.raw = (pNVar2->name).numFlags.raw;
    local_38.rawLen = (pNVar2->name).rawLen;
    local_38.info._0_4_ = *(undefined4 *)&(pNVar2->name).info;
    local_38.info._4_4_ = *(undefined4 *)((long)&(pNVar2->name).info + 4);
  }
  else {
    local_38.kind = (pNVar1->name).kind;
    local_38._2_1_ = (pNVar1->name).field_0x2;
    local_38.numFlags.raw = (pNVar1->name).numFlags.raw;
    local_38.rawLen = (pNVar1->name).rawLen;
    local_38.info._0_4_ = *(undefined4 *)&(pNVar1->name).info;
    local_38.info._4_4_ = *(undefined4 *)((long)&(pNVar1->name).info + 4);
  }
  sVar6 = parsing::Token::valueText(&local_38);
  SVar4 = parsing::Token::location(&local_38);
LAB_00229d9a:
  SVar3 = SemanticFacts::getStatementBlockKind(syntax);
  loc._4_4_ = 0;
  loc._0_4_ = SVar3;
  name._M_str = (char *)SVar4;
  name._M_len = (size_t)sVar6._M_str;
  pSVar5 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)sVar6._M_len,name,loc,
                       Sequential,(optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffc0)
  ;
  sVar7 = Statement::createAndAddBlockItems(&pSVar5->super_Scope,&syntax->items);
  pSVar5->blocks = sVar7;
  return pSVar5;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const BlockStatementSyntax& syntax) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.blockName) {
        auto token = syntax.blockName->name;
        name = token.valueText();
        loc = token.location();
    }
    else {
        std::tie(name, loc) = getLabel(syntax, syntax.begin.location());
    }

    auto result = createBlock(scope, syntax, name, loc,
                              SemanticFacts::getStatementBlockKind(syntax));

    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);
    return *result;
}